

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  byte bVar1;
  PyTypeObject *type;
  pointer pptVar2;
  type_info *find_type;
  pointer pp_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  ulong uVar8;
  pointer pptVar9;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  pointer pp_Var10;
  value_and_holder local_50;
  
  if (this->typeinfo == (type_info *)0x0 || src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    if (convert) {
      this->value = (void *)0x0;
      return true;
    }
    return false;
  }
  type = (src.m_ptr)->ob_type;
  if (type == this->typeinfo->type) {
LAB_00122020:
    instance::get_value_and_holder(&local_50,(instance *)src.m_ptr,(type_info *)0x0);
LAB_00122036:
    this->value = *local_50.vh;
    return true;
  }
  iVar5 = PyType_IsSubtype(type);
  if (iVar5 == 0) goto LAB_001220c4;
  pvVar7 = all_type_info(type);
  bVar1 = this->typeinfo->field_0x80;
  pptVar9 = (pvVar7->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (pvVar7->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pptVar2 - (long)pptVar9;
  if (uVar8 == 8) {
    if (((bVar1 & 1) != 0) || ((*pptVar9)->type == this->typeinfo->type)) goto LAB_00122020;
  }
  else if (8 < uVar8) {
    do {
      if (pptVar9 == pptVar2) goto LAB_001220a9;
      find_type = *pptVar9;
      if ((bVar1 & 1) == 0) {
        uVar6 = (uint)(find_type->type == this->typeinfo->type);
      }
      else {
        uVar6 = PyType_IsSubtype();
      }
      pptVar9 = pptVar9 + 1;
    } while (uVar6 == 0);
    instance::get_value_and_holder(&local_50,(instance *)src.m_ptr,find_type);
    goto LAB_00122036;
  }
LAB_001220a9:
  bVar4 = try_implicit_casts(this,src,convert);
  if (bVar4) {
    return true;
  }
LAB_001220c4:
  if (convert) {
    pp_Var10 = (this->typeinfo->implicit_conversions).
               super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pp_Var3 = (this->typeinfo->implicit_conversions).
              super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (pp_Var10 != pp_Var3) {
      local_50.inst = (instance *)(**pp_Var10)(src.m_ptr,this->typeinfo->type);
      object::operator=(&this->temp,(object *)&local_50);
      object::~object((object *)&local_50);
      bVar4 = load_impl<pybind11::detail::type_caster_generic>
                        (this,(this->temp).super_handle.m_ptr,false);
      pp_Var10 = pp_Var10 + 1;
      if (bVar4) {
        return true;
      }
    }
    bVar4 = try_direct_conversions(this,src);
    if (bVar4) {
      return true;
    }
  }
  return false;
}

Assistant:

PYBIND11_NOINLINE bool load_impl(handle src, bool convert) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            // Defer accepting None to other overloads (if we aren't in convert mode):
            if (!convert) return false;
            value = nullptr;
            return true;
        }

        auto &this_ = static_cast<ThisT &>(*this);
        this_.check_holder_compat();

        PyTypeObject *srctype = Py_TYPE(src.ptr());

        // Case 1: If src is an exact type match for the target type then we can reinterpret_cast
        // the instance's value pointer to the target type:
        if (srctype == typeinfo->type) {
            this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
            return true;
        }
        // Case 2: We have a derived class
        else if (PyType_IsSubtype(srctype, typeinfo->type)) {
            auto &bases = all_type_info(srctype);
            bool no_cpp_mi = typeinfo->simple_type;

            // Case 2a: the python type is a Python-inherited derived class that inherits from just
            // one simple (no MI) pybind11 class, or is an exact match, so the C++ instance is of
            // the right type and we can use reinterpret_cast.
            // (This is essentially the same as case 2b, but because not using multiple inheritance
            // is extremely common, we handle it specially to avoid the loop iterator and type
            // pointer lookup overhead)
            if (bases.size() == 1 && (no_cpp_mi || bases.front()->type == typeinfo->type)) {
                this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
                return true;
            }
            // Case 2b: the python type inherits from multiple C++ bases.  Check the bases to see if
            // we can find an exact match (or, for a simple C++ type, an inherited match); if so, we
            // can safely reinterpret_cast to the relevant pointer.
            else if (bases.size() > 1) {
                for (auto base : bases) {
                    if (no_cpp_mi ? PyType_IsSubtype(base->type, typeinfo->type) : base->type == typeinfo->type) {
                        this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder(base));
                        return true;
                    }
                }
            }

            // Case 2c: C++ multiple inheritance is involved and we couldn't find an exact type match
            // in the registered bases, above, so try implicit casting (needed for proper C++ casting
            // when MI is involved).
            if (this_.try_implicit_casts(src, convert))
                return true;
        }

        // Perform an implicit conversion
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load_impl<ThisT>(temp, false))
                    return true;
            }
            if (this_.try_direct_conversions(src))
                return true;
        }
        return false;
    }